

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

string * cmCTest::SafeBuildIdField(string *__return_storage_ptr__,string *value)

{
  pointer pcVar1;
  undefined1 *puVar2;
  int iVar3;
  long lVar4;
  char replace [2];
  string local_68;
  cmXMLSafe local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + value->_M_string_length);
  iVar3 = std::__cxx11::string::compare((char *)__return_storage_ptr__);
  if (iVar3 != 0) {
    lVar4 = std::__cxx11::string::find_first_of((char *)__return_storage_ptr__,0x584838,0);
    if (lVar4 != -1) {
      local_68._M_dataplus._M_p._1_1_ = 0;
      lVar4 = 0;
      do {
        local_68._M_dataplus._M_p._0_1_ = "\\:*?\"<>|\n\r\t\f\v"[lVar4];
        cmsys::SystemTools::ReplaceString(__return_storage_ptr__,(char *)&local_68,"");
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0xd);
    }
    cmXMLSafe::cmXMLSafe(&local_48,__return_storage_ptr__);
    cmXMLSafe::str_abi_cxx11_(&local_68,&local_48);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
    puVar2 = (undefined1 *)
             CONCAT62(local_68._M_dataplus._M_p._2_6_,
                      CONCAT11(local_68._M_dataplus._M_p._1_1_,(char)local_68._M_dataplus._M_p));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar2 != &local_68.field_2) {
      operator_delete(puVar2,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  iVar3 = std::__cxx11::string::compare((char *)__return_storage_ptr__);
  if (iVar3 == 0) {
    std::__cxx11::string::_M_replace
              ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
               0x584846);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::SafeBuildIdField(const std::string& value)
{
  std::string safevalue(value);

  if (safevalue != "")
    {
    // Disallow non-filename and non-space whitespace characters.
    // If they occur, replace them with ""
    //
    const char *disallowed = "\\:*?\"<>|\n\r\t\f\v";

    if (safevalue.find_first_of(disallowed) != value.npos)
      {
      std::string::size_type i = 0;
      std::string::size_type n = strlen(disallowed);
      char replace[2];
      replace[1] = 0;

      for (i= 0; i<n; ++i)
        {
        replace[0] = disallowed[i];
        cmSystemTools::ReplaceString(safevalue, replace, "");
        }
      }

    safevalue = cmXMLSafe(safevalue).str();
    }

  if (safevalue == "")
    {
    safevalue = "(empty)";
    }

  return safevalue;
}